

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O0

GenericPoint<long> plot::operator+(GenericPoint<long> *lhs,GenericPoint<long> *rhs)

{
  GenericPoint<long> *rhs_local;
  GenericPoint<long> *lhs_local;
  
  GenericPoint<long>::GenericPoint((GenericPoint<long> *)&lhs_local,lhs->x + rhs->x,lhs->y + rhs->y)
  ;
  return _lhs_local;
}

Assistant:

inline constexpr GenericPoint<T> operator+(GenericPoint<T> const& lhs, GenericPoint<T> const& rhs) {
    return {
        lhs.x + rhs.x,
        lhs.y + rhs.y
    };
}